

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_string_hash(asmcode *code,compiler_options *ops)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  skiwi *psVar2;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  string repeat;
  string done;
  string error;
  operand local_90 [4];
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar2 = label;
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_80,psVar2,in_RDX);
    std::__cxx11::string::operator=((string *)&local_40,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_80._M_dataplus._M_p._0_4_ = 5;
    local_60._M_dataplus._M_p._0_4_ = 0x14;
    local_90[0] = NUMBER;
    local_90[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_80,(operand *)&local_60,local_90,(int *)(local_90 + 1));
    local_80._M_dataplus._M_p._0_4_ = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_80,&local_40);
    jump_if_arg_is_not_block(code,RCX,R11,&local_40);
  }
  local_60._M_dataplus._M_p._0_4_ = 2;
  local_90[0] = RCX;
  local_90[1] = 0x39;
  local_80._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&local_60,local_90,local_90 + 1,(unsigned_long *)&local_80);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_string(code,RCX,R11,&local_40);
  }
  local_80._M_dataplus._M_p._0_4_ = 0x4b;
  local_60._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60);
  local_80._M_dataplus._M_p._0_4_ = 0x4b;
  local_60._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 0x14;
  local_90[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60,local_90);
  local_60._M_dataplus._M_p._0_4_ = 0x40;
  local_90[0] = RAX;
  local_90[1] = 0x39;
  local_80._M_dataplus._M_p = (pointer)0xffffffffffffff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,(operation *)&local_60,local_90,local_90 + 1,(long *)&local_80);
  local_80._M_dataplus._M_p._0_4_ = 2;
  local_60._M_dataplus._M_p._0_4_ = 0x14;
  local_90[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60,local_90);
  local_80._M_dataplus._M_p._0_4_ = 0;
  local_60._M_dataplus._M_p._0_4_ = 0xb;
  local_90[0] = NUMBER;
  local_90[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,(operand *)&local_60,local_90,(int *)(local_90 + 1));
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 9;
  local_90[0] = MEM_RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60,local_90);
  local_80._M_dataplus._M_p._0_4_ = 0;
  local_60._M_dataplus._M_p._0_4_ = 0xb;
  local_90[0] = NUMBER;
  local_90[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_80,(operand *)&local_60,local_90,(int *)(local_90 + 1));
  local_80._M_dataplus._M_p._0_4_ = 0xd;
  local_60._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60);
  local_60._M_dataplus._M_p._0_4_ = 0x40;
  local_90[0] = R15;
  local_90[1] = 0x39;
  local_80._M_dataplus._M_p = (pointer)0xd088016b;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
            (code,(operation *)&local_60,local_90,local_90 + 1,(long *)&local_80);
  local_80._M_dataplus._M_p._0_4_ = 0x45;
  local_60._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60);
  local_80._M_dataplus._M_p._0_4_ = 0x40;
  local_60._M_dataplus._M_p._0_4_ = 10;
  local_90[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&local_80,(operand *)&local_60,local_90);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_80,psVar2,lab);
  psVar2 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar2,lab_00);
  local_90[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_90,&local_80);
  local_90[0] = XMM13|RBX;
  local_90[1] = 0x14;
  local_90[2] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_90,&local_60);
  local_90[0] = ST6;
  local_90[1] = 9;
  local_90[2] = 0x1b;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM2;
  local_90[1] = 0x18;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_90,local_90 + 1);
  local_90[0] = XMM13|RDX;
  local_90[1] = 10;
  local_90[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = RSI;
  local_90[1] = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_90,local_90 + 1);
  local_90[0] = EMPTY;
  local_90[1] = 0xb;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_90,&local_80);
  local_90[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_90,&local_60);
  local_90[0] = ST6;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = XMM13|CH;
  local_90[1] = 10;
  local_90[2] = 0x39;
  local_90[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|RDX;
  local_90[1] = 9;
  local_90[2] = 10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_90,local_90 + 1,local_90 + 2);
  local_90[0] = AH;
  local_90[1] = 9;
  local_90[2] = 0x39;
  local_90[3] = 0xff;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM13|CL;
  local_90[1] = 9;
  local_90[2] = 0x39;
  local_90[3] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_90,local_90 + 1,local_90 + 2,(int *)(local_90 + 3));
  local_90[0] = XMM7;
  local_90[1] = 0xc;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_90,local_90 + 1);
  local_90[0] = XMM7;
  local_90[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_90,local_90 + 1);
  local_90[0] = BYTE_MEM_RDX;
  local_90[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_90,local_90 + 1);
  if (ops->safe_primitives == true) {
    error_label(code,&local_40,re_string_hash_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_string_hash(asmcode& code, const compiler_options& ops)
  {

  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xfffffffffffffff8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    }

  code.add(asmcode::PUSH, asmcode::RBX);
  code.add(asmcode::PUSH, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::R11, asmcode::MEM_RCX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, block_size_mask);
  code.add(asmcode::AND, asmcode::R11, asmcode::RAX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));

  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, 3498574187);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::MOV, asmcode::RBX, asmcode::RAX);

  auto repeat = label_to_string(label++);
  auto done = label_to_string(label++);

  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::TEST, asmcode::R11, asmcode::R11);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
  code.add(asmcode::MUL, asmcode::R15);
  code.add(asmcode::XOR, asmcode::RBX, asmcode::RAX);
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  code.add(asmcode::MOV, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SHR, asmcode::RBX, asmcode::NUMBER, 8);
  code.add(asmcode::XOR, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 255);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::POP, asmcode::RDX);
  code.add(asmcode::POP, asmcode::RBX);
  code.add(asmcode::JMP, CONTINUE);

  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_hash_contract_violation);
    }
  }